

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  Location loc_00;
  bool bVar1;
  Result result;
  ulong uVar2;
  char *format;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_R9;
  undefined1 local_60 [8];
  string end_label;
  Location loc;
  string *begin_label_local;
  WastParser *this_local;
  
  GetLocation((Location *)((long)&end_label.field_2 + 8),this);
  std::__cxx11::string::string((string *)local_60);
  result = ParseLabelOpt(this,(string *)local_60);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        bVar1 = std::operator!=(begin_label,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
        if (bVar1) {
          uVar3 = std::__cxx11::string::c_str();
          uVar4 = std::__cxx11::string::c_str();
          loc_00.filename._M_str = (char *)loc.filename._M_len;
          loc_00.filename._M_len = end_label.field_2._8_8_;
          loc_00.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               loc.filename._M_str;
          loc_00.field_1._8_8_ = loc.field_1.field_1.offset;
          Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",uVar3,uVar4,loc.filename._M_str,
                in_R9);
        }
      }
      else {
        format = (char *)std::__cxx11::string::c_str();
        Error(this,0x31cc3f,format);
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::__cxx11::string::~string((string *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}